

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itree.c
# Opt level: O3

cell_index_t
itree_add_tri(itree_t *t,cell_id_t left_context,cell_id_t right_context,cell_id_t posn,
             cell_id_t tri_id)

{
  cell_t *pcVar1;
  cell_t *pcVar2;
  uint uVar3;
  cell_index_t cVar4;
  uint uVar5;
  ulong uVar6;
  
  pcVar1 = t->cell;
  if (pcVar1->id == 0xffffffff) {
    uVar5 = 0;
  }
  else {
    uVar3 = 0;
    do {
      uVar5 = uVar3;
      if (pcVar1[uVar5].id == left_context) {
        uVar5 = pcVar1[uVar5].child;
        uVar6 = (ulong)uVar5;
        if (pcVar1[uVar6].id == 0xffffffff) goto LAB_00123105;
        if (uVar5 != 0xffffffff) goto LAB_001230e0;
        uVar5 = 0xffffffff;
        goto LAB_00123105;
      }
      uVar3 = pcVar1[uVar5].sib;
    } while (pcVar1[uVar5].sib != 0xffffffff);
  }
  cVar4 = itree_add_sib(t,uVar5,left_context);
  cVar4 = itree_add_child(t,cVar4,right_context);
  goto LAB_00123110;
  while (pcVar2 = pcVar1 + uVar6, uVar6 = (ulong)pcVar2->sib, pcVar2->sib != 0xffffffff) {
LAB_001230e0:
    uVar5 = (uint)uVar6;
    if (pcVar1[uVar6].id == right_context) {
      uVar5 = pcVar1[uVar6].child;
      uVar6 = (ulong)uVar5;
      if (pcVar1[uVar6].id != 0xffffffff) {
        if (uVar5 == 0xffffffff) {
          uVar5 = 0xffffffff;
        }
        else {
          do {
            uVar5 = (uint)uVar6;
            if (pcVar1[uVar6].id == posn) {
              return uVar5;
            }
            pcVar2 = pcVar1 + uVar6;
            uVar6 = (ulong)pcVar2->sib;
          } while (pcVar2->sib != 0xffffffff);
        }
      }
      uVar5 = itree_add_sib(t,uVar5,posn);
      goto LAB_0012311c;
    }
  }
LAB_00123105:
  cVar4 = itree_add_sib(t,uVar5,right_context);
LAB_00123110:
  uVar5 = itree_add_child(t,cVar4,posn);
LAB_0012311c:
  t->cell[uVar5].child = tri_id;
  return uVar5;
}

Assistant:

cell_id_t
itree_add_tri(itree_t *t,
	      cell_id_t left_context,
	      cell_id_t right_context,
	      cell_id_t posn,
	      cell_id_t tri_id)
{
    cell_index_t end;
    cell_index_t parent;

    parent = itree_find(t, &end, 0, left_context);
    if (parent == NULL_INDEX) {
	parent = itree_add_sib(t, end, left_context);
	parent = itree_add_child(t, parent, right_context);
	parent = itree_add_child(t, parent, posn);

	t->cell[parent].child = tri_id;

	return parent;
    }

    parent = itree_find(t, &end, t->cell[parent].child, right_context);
    if (parent == NULL_INDEX) {
	parent = itree_add_sib(t, end, right_context);
	parent = itree_add_child(t, parent, posn);

	t->cell[parent].child = tri_id;

	return parent;
    }
    
    parent = itree_find(t, &end, t->cell[parent].child, posn);
    if (parent == NULL_INDEX) {
	parent = itree_add_sib(t, end, posn);
	
	t->cell[parent].child = tri_id;

	return parent;
    }

    return parent;
}